

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_symboltable.c
# Opt level: O2

uint32_t symboltable_exit_scope(symboltable_t *table,uint32_t *nlevel)

{
  ghash_r *pgVar1;
  size_t sVar2;
  gravity_hash_t *hashtable;
  
  pgVar1 = table->stack;
  sVar2 = pgVar1->n;
  if (sVar2 == 0) {
    hashtable = (gravity_hash_t *)0x0;
  }
  else {
    pgVar1->n = sVar2 - 1;
    hashtable = pgVar1->p[sVar2 - 1];
  }
  if (nlevel != (uint32_t *)0x0) {
    *nlevel = 0xffffffff;
    gravity_hash_iterate(hashtable,check_upvalue_inscope,nlevel);
  }
  gravity_hash_free(hashtable);
  return (uint32_t)table->count1;
}

Assistant:

uint32_t symboltable_exit_scope (symboltable_t *table, uint32_t *nlevel) {
    gravity_hash_t *h = (gravity_hash_t *)scope_stack_pop(table->stack);
    if (nlevel) {
        *nlevel = UINT32_MAX;
        gravity_hash_iterate(h, check_upvalue_inscope, (void *)nlevel);
    }
    gravity_hash_free(h);
    return table->count1;
}